

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O3

void __thiscall
btConnectivityProcessor::processTriangle
          (btConnectivityProcessor *this,btVector3 *triangle,int partId,int triangleIndex)

{
  btTriangleInfoMap *pbVar1;
  btVector3 *pbVar2;
  btTriangleInfo *pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  btScalar *pbVar9;
  int j;
  long lVar10;
  uint uVar11;
  btVector3 *pbVar12;
  btVector3 *pbVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  btVector3 bVar25;
  btVector3 normalB;
  btVector3 normalA;
  btTriangleShape tB;
  btTriangleShape tA;
  float local_1e8;
  float fStack_1e4;
  int local_1c8;
  btVector3 local_1b0;
  btTriangleInfo *local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  btVector3 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  int local_150 [4];
  btQuaternion local_140;
  btTriangleShape local_130;
  undefined1 local_b0 [8];
  btScalar bStack_a8;
  btScalar local_a4;
  btScalar local_60 [2];
  btScalar abStack_58 [2];
  btScalar local_50 [2];
  btScalar abStack_48 [2];
  btScalar local_40 [2];
  btScalar abStack_38 [2];
  
  iVar6 = this->m_partIdA;
  uVar11 = this->m_triangleIndexA;
  if (triangleIndex != uVar11 || partId != iVar6) {
    local_150[2] = 0xffffffff;
    local_150[0] = -1;
    local_150[1] = -1;
    local_190 = 0xffffffff;
    local_198 = 0xffffffffffffffff;
    fVar14 = triangle[1].m_floats[0] - triangle->m_floats[0];
    fVar18 = triangle[1].m_floats[1] - triangle->m_floats[1];
    fVar15 = triangle[1].m_floats[2] - triangle->m_floats[2];
    fVar21 = triangle[2].m_floats[0] - triangle->m_floats[0];
    fVar16 = triangle[2].m_floats[1] - triangle->m_floats[1];
    fVar17 = triangle[2].m_floats[2] - triangle->m_floats[2];
    fVar19 = fVar18 * fVar17 - fVar16 * fVar15;
    fVar15 = fVar15 * fVar21 - fVar17 * fVar14;
    fVar16 = fVar16 * fVar14 - fVar21 * fVar18;
    pbVar1 = this->m_triangleInfoMap;
    fVar14 = pbVar1->m_equalVertexThreshold;
    if ((fVar14 <= fVar16 * fVar16 + fVar19 * fVar19 + fVar15 * fVar15) &&
       (pbVar2 = this->m_triangleVerticesA, fVar15 = pbVar2[1].m_floats[0] - pbVar2->m_floats[0],
       fVar19 = pbVar2[1].m_floats[1] - pbVar2->m_floats[1],
       fVar16 = pbVar2[1].m_floats[2] - pbVar2->m_floats[2],
       fVar23 = pbVar2[2].m_floats[0] - pbVar2->m_floats[0],
       fVar17 = pbVar2[2].m_floats[1] - pbVar2->m_floats[1],
       fVar18 = pbVar2[2].m_floats[2] - pbVar2->m_floats[2],
       fVar21 = fVar19 * fVar18 - fVar17 * fVar16, fVar16 = fVar16 * fVar23 - fVar18 * fVar15,
       fVar15 = fVar17 * fVar15 - fVar23 * fVar19,
       fVar14 <= fVar15 * fVar15 + fVar21 * fVar21 + fVar16 * fVar16)) {
      lVar7 = 0;
      iVar8 = 0;
      do {
        fVar15 = pbVar2[lVar7].m_floats[0];
        fVar16 = pbVar2[lVar7].m_floats[1];
        fVar17 = pbVar2[lVar7].m_floats[2];
        lVar10 = 0;
        pbVar9 = triangle->m_floats + 2;
        do {
          fVar18 = fVar15 - ((btVector3 *)(pbVar9 + -2))->m_floats[0];
          fVar19 = fVar16 - pbVar9[-1];
          fVar21 = fVar17 - *pbVar9;
          if (fVar21 * fVar21 + fVar18 * fVar18 + fVar19 * fVar19 < fVar14) {
            local_150[iVar8] = (int)lVar7;
            *(int *)((long)&local_198 + (long)iVar8 * 4) = (int)lVar10;
            if (1 < iVar8) {
              return;
            }
            iVar8 = iVar8 + 1;
          }
          lVar10 = lVar10 + 1;
          pbVar9 = pbVar9 + 4;
        } while (lVar10 != 3);
        if (2 < iVar8) {
          return;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if (iVar8 == 2) {
        iVar8 = local_150[1];
        local_1c8 = local_150[0];
        if (local_150[1] == 2 && local_150[0] == 0) {
          local_150[0] = 2;
          local_150[1] = 0;
          local_198 = CONCAT44((int)local_198,(int)((ulong)local_198 >> 0x20));
          local_1c8 = 2;
          iVar8 = 0;
        }
        uVar11 = iVar6 << 0x15 | uVar11;
        local_b0._0_4_ = uVar11;
        iVar6 = btHashMap<btHashInt,_btTriangleInfo>::findIndex
                          (&pbVar1->super_btInternalTriangleInfoMap,(btHashInt *)local_b0);
        pbVar3 = (pbVar1->super_btInternalTriangleInfoMap).m_valueArray.m_data;
        if (pbVar3 == (btTriangleInfo *)0x0 || iVar6 == -1) {
          local_b0._4_4_ = 6.2831855;
          bStack_a8 = 6.2831855;
          local_a4 = 6.2831855;
          local_b0._0_4_ = 0;
          local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
          super_btCollisionShape._vptr_btCollisionShape._0_4_ = uVar11;
          btHashMap<btHashInt,_btTriangleInfo>::insert
                    (&this->m_triangleInfoMap->super_btInternalTriangleInfoMap,
                     (btHashInt *)&local_130,(btTriangleInfo *)local_b0);
          pbVar1 = this->m_triangleInfoMap;
          local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
          super_btCollisionShape._vptr_btCollisionShape =
               (_func_int **)
               CONCAT44(local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.
                        super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape._4_4_,
                        uVar11);
          iVar6 = btHashMap<btHashInt,_btTriangleInfo>::findIndex
                            (&pbVar1->super_btInternalTriangleInfoMap,(btHashInt *)&local_130);
          local_1a0 = (btTriangleInfo *)0x0;
          if (iVar6 != -1) {
            local_1a0 = (pbVar1->super_btInternalTriangleInfoMap).m_valueArray.m_data + iVar6;
          }
        }
        else {
          local_1a0 = pbVar3 + iVar6;
        }
        pbVar2 = this->m_triangleVerticesA;
        fVar14 = pbVar2[iVar8].m_floats[0] - pbVar2[local_1c8].m_floats[0];
        local_168 = *(undefined8 *)(pbVar2[iVar8].m_floats + 1);
        uStack_160 = 0;
        local_178 = *(undefined8 *)(pbVar2[local_1c8].m_floats + 1);
        uStack_170 = 0;
        btPolyhedralConvexShape::btPolyhedralConvexShape((btPolyhedralConvexShape *)local_b0);
        local_b0._0_4_ = 0x21c238;
        local_b0._4_4_ = 0.0;
        bStack_a8 = 1.4013e-45;
        local_60 = *(btScalar (*) [2])pbVar2->m_floats;
        abStack_58 = *(btScalar (*) [2])(pbVar2->m_floats + 2);
        local_50 = *(btScalar (*) [2])pbVar2[1].m_floats;
        abStack_48 = *(btScalar (*) [2])(pbVar2[1].m_floats + 2);
        local_40 = *(btScalar (*) [2])pbVar2[2].m_floats;
        abStack_38 = *(btScalar (*) [2])(pbVar2[2].m_floats + 2);
        iVar6 = (int)local_198;
        lVar10 = (long)(int)local_198;
        iVar5 = local_198._4_4_;
        lVar7 = (long)local_198._4_4_;
        btPolyhedralConvexShape::btPolyhedralConvexShape(&local_130.super_btPolyhedralConvexShape);
        pbVar13 = triangle + lVar10;
        pbVar12 = triangle + ((3 - iVar5) - iVar6);
        local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape._vptr_btCollisionShape =
             (_func_int **)&PTR__btPolyhedralConvexShape_0021c238;
        local_130.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape.m_shapeType = 1;
        local_130.m_vertices1[0].m_floats._0_8_ = *(undefined8 *)triangle[lVar7].m_floats;
        local_130.m_vertices1[0].m_floats._8_8_ = *(undefined8 *)(triangle[lVar7].m_floats + 2);
        local_130.m_vertices1[1].m_floats._0_8_ = *(undefined8 *)pbVar13->m_floats;
        local_130.m_vertices1[1].m_floats._8_8_ = *(undefined8 *)(pbVar13->m_floats + 2);
        local_130.m_vertices1[2].m_floats._0_8_ = *(undefined8 *)pbVar12->m_floats;
        local_130.m_vertices1[2].m_floats._8_8_ = *(undefined8 *)(pbVar12->m_floats + 2);
        btTriangleShape::calcNormal((btTriangleShape *)local_b0,&local_188);
        btTriangleShape::calcNormal(&local_130,&local_1b0);
        iVar8 = iVar8 + local_1c8;
        iVar6 = 3 - iVar8;
        fVar19 = (float)local_168 - (float)local_178;
        fVar15 = local_168._4_4_ - local_178._4_4_;
        fVar18 = 1.0 / SQRT(fVar15 * fVar15 + fVar14 * fVar14 + fVar19 * fVar19);
        fVar14 = fVar14 * fVar18;
        fVar19 = fVar18 * fVar19;
        fVar18 = fVar18 * fVar15;
        fVar17 = local_188.m_floats[2] * fVar19 - local_188.m_floats[1] * fVar18;
        fVar15 = local_188.m_floats[0] * fVar18 - local_188.m_floats[2] * fVar14;
        fVar21 = local_188.m_floats[1] * fVar14 - local_188.m_floats[0] * fVar19;
        fVar16 = 1.0 / SQRT(fVar21 * fVar21 + fVar17 * fVar17 + fVar15 * fVar15);
        fVar21 = fVar21 * fVar16;
        pbVar2 = this->m_triangleVerticesA;
        fVar17 = fVar16 * fVar17;
        fVar16 = fVar16 * fVar15;
        fVar15 = 0.0;
        if ((pbVar2[iVar6].m_floats[2] - pbVar2[local_1c8].m_floats[2]) * fVar21 +
            (pbVar2[iVar6].m_floats[0] - pbVar2[local_1c8].m_floats[0]) * fVar17 +
            fVar16 * (pbVar2[iVar6].m_floats[1] - pbVar2[local_1c8].m_floats[1]) < 0.0) {
          fVar17 = -fVar17;
          fVar16 = -fVar16;
          fVar21 = -fVar21;
        }
        fVar23 = local_1b0.m_floats[2] * fVar19 - fVar18 * local_1b0.m_floats[1];
        fVar18 = local_1b0.m_floats[0] * fVar18 - fVar14 * local_1b0.m_floats[2];
        fVar14 = fVar14 * local_1b0.m_floats[1] - local_1b0.m_floats[0] * fVar19;
        fVar19 = 1.0 / SQRT(fVar14 * fVar14 + fVar23 * fVar23 + fVar18 * fVar18);
        fVar14 = fVar14 * fVar19;
        fVar23 = fVar19 * fVar23;
        fVar19 = fVar19 * fVar18;
        if ((pbVar12->m_floats[2] - pbVar13->m_floats[2]) * fVar14 +
            (pbVar12->m_floats[0] - pbVar13->m_floats[0]) * fVar23 +
            fVar19 * (pbVar12->m_floats[1] - pbVar13->m_floats[1]) < 0.0) {
          fVar23 = -fVar23;
          fVar19 = -fVar19;
          fVar14 = -fVar14;
        }
        fVar20 = fVar16 * fVar14 - fVar19 * fVar21;
        fVar18 = fVar21 * fVar23 - fVar14 * fVar17;
        fVar22 = fVar17 * fVar19 - fVar23 * fVar16;
        fVar24 = fVar22 * fVar22 + fVar20 * fVar20 + fVar18 * fVar18;
        if (this->m_triangleInfoMap->m_planarEpsilon <= fVar24) {
          fVar15 = 1.0 / SQRT(fVar24);
          fVar24 = fVar18 * fVar15 * fVar21 - fVar16 * fVar22 * fVar15;
          fVar22 = fVar22 * fVar15 * fVar17 - fVar21 * fVar20 * fVar15;
          fVar18 = fVar20 * fVar15 * fVar16 - fVar17 * fVar18 * fVar15;
          fVar15 = 1.0 / SQRT(fVar18 * fVar18 + fVar24 * fVar24 + fVar22 * fVar22);
          fVar15 = atan2f(fVar15 * fVar18 * fVar14 +
                          fVar24 * fVar15 * fVar23 + fVar22 * fVar15 * fVar19,
                          fVar14 * fVar21 + fVar23 * fVar17 + fVar16 * fVar19);
          fVar15 = 3.1415927 - fVar15;
          fVar14 = local_188.m_floats[2] * fVar14 +
                   local_188.m_floats[0] * fVar23 + local_188.m_floats[1] * fVar19;
          bVar4 = fVar14 < 0.0;
          if (0.0 <= fVar14) {
            fVar15 = -fVar15;
          }
        }
        else {
          bVar4 = false;
        }
        if (iVar8 == 3) {
          pbVar2 = this->m_triangleVerticesA;
          fVar14 = pbVar2[1].m_floats[2] - pbVar2[2].m_floats[2];
          local_168 = CONCAT44(local_168._4_4_,fVar15 * -0.5);
          fVar17 = (float)*(undefined8 *)pbVar2[1].m_floats -
                   (float)*(undefined8 *)pbVar2[2].m_floats;
          fVar18 = (float)((ulong)*(undefined8 *)pbVar2[1].m_floats >> 0x20) -
                   (float)((ulong)*(undefined8 *)pbVar2[2].m_floats >> 0x20);
          local_178 = CONCAT44(local_178._4_4_,
                               SQRT(fVar14 * fVar14 + fVar17 * fVar17 + fVar18 * fVar18));
          fVar16 = sinf(fVar15 * -0.5);
          fVar16 = fVar16 / (float)local_178;
          local_140.super_btQuadWord.m_floats[3] = cosf((float)local_168);
          local_140.super_btQuadWord.m_floats[0] = fVar16 * fVar17;
          local_140.super_btQuadWord.m_floats[1] = fVar16 * fVar18;
          local_140.super_btQuadWord.m_floats[2] = fVar14 * fVar16;
          bVar25 = quatRotate(&local_140,&local_188);
          if (bVar25.m_floats[2] * local_1b0.m_floats[2] +
              local_1b0.m_floats[0] * bVar25.m_floats[0] +
              bVar25.m_floats[1] * local_1b0.m_floats[1] < 0.0) {
            *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 0x10;
          }
          local_1a0->m_edgeV1V2Angle = -fVar15;
          if (bVar4) {
            *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 2;
          }
        }
        else if (iVar8 == 2) {
          pbVar2 = this->m_triangleVerticesA;
          fVar14 = pbVar2[2].m_floats[2] - pbVar2->m_floats[2];
          local_168 = CONCAT44(local_168._4_4_,fVar15 * -0.5);
          fVar17 = (float)*(undefined8 *)pbVar2[2].m_floats - (float)*(undefined8 *)pbVar2->m_floats
          ;
          fVar18 = (float)((ulong)*(undefined8 *)pbVar2[2].m_floats >> 0x20) -
                   (float)((ulong)*(undefined8 *)pbVar2->m_floats >> 0x20);
          local_178 = CONCAT44(local_178._4_4_,
                               SQRT(fVar14 * fVar14 + fVar17 * fVar17 + fVar18 * fVar18));
          fVar16 = sinf(fVar15 * -0.5);
          fVar16 = fVar16 / (float)local_178;
          local_140.super_btQuadWord.m_floats[3] = cosf((float)local_168);
          local_140.super_btQuadWord.m_floats[0] = fVar16 * fVar17;
          local_140.super_btQuadWord.m_floats[1] = fVar16 * fVar18;
          local_140.super_btQuadWord.m_floats[2] = fVar14 * fVar16;
          bVar25 = quatRotate(&local_140,&local_188);
          if (bVar25.m_floats[2] * local_1b0.m_floats[2] +
              local_1b0.m_floats[0] * bVar25.m_floats[0] +
              bVar25.m_floats[1] * local_1b0.m_floats[1] < 0.0) {
            *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 0x20;
          }
          local_1a0->m_edgeV2V0Angle = -fVar15;
          if (bVar4) {
            *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 4;
          }
        }
        else if (iVar8 == 1) {
          pbVar2 = this->m_triangleVerticesA;
          fVar14 = pbVar2->m_floats[2] - pbVar2[1].m_floats[2];
          local_168 = CONCAT44(local_168._4_4_,fVar15 * -0.5);
          fVar17 = (float)*(undefined8 *)pbVar2->m_floats - (float)*(undefined8 *)pbVar2[1].m_floats
          ;
          fVar18 = (float)((ulong)*(undefined8 *)pbVar2->m_floats >> 0x20) -
                   (float)((ulong)*(undefined8 *)pbVar2[1].m_floats >> 0x20);
          local_178 = CONCAT44(local_178._4_4_,
                               SQRT(fVar14 * fVar14 + fVar17 * fVar17 + fVar18 * fVar18));
          fVar16 = sinf(fVar15 * -0.5);
          fVar16 = fVar16 / (float)local_178;
          local_140.super_btQuadWord.m_floats[3] = cosf((float)local_168);
          local_140.super_btQuadWord.m_floats[0] = fVar16 * fVar17;
          local_140.super_btQuadWord.m_floats[1] = fVar16 * fVar18;
          local_140.super_btQuadWord.m_floats[2] = fVar14 * fVar16;
          bVar25 = quatRotate(&local_140,&local_188);
          if (bVar25.m_floats[2] * local_1b0.m_floats[2] +
              local_1b0.m_floats[0] * bVar25.m_floats[0] +
              bVar25.m_floats[1] * local_1b0.m_floats[1] < 0.0) {
            *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 8;
          }
          local_1a0->m_edgeV0V1Angle = -fVar15;
          if (bVar4) {
            *(byte *)&local_1a0->m_flags = (byte)local_1a0->m_flags | 1;
          }
        }
        btPolyhedralConvexShape::~btPolyhedralConvexShape(&local_130.super_btPolyhedralConvexShape);
        btPolyhedralConvexShape::~btPolyhedralConvexShape((btPolyhedralConvexShape *)local_b0);
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3]={-1,-1,-1};
		int sharedVertsB[3]={-1,-1,-1};

		///skip degenerate triangles
		btScalar crossBSqr = ((triangle[1]-triangle[0]).cross(triangle[2]-triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;


		btScalar crossASqr = ((m_triangleVerticesA[1]-m_triangleVerticesA[0]).cross(m_triangleVerticesA[2]-m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr< m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i=0;i<3;i++)
		{
			for (int j=0;j<3;j++)
			{
				if ( (m_triangleVerticesA[i]-triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if(numshared >= 3)
						return;
				}
			}
			///degenerate case
			if(numshared >= 3)
				return;
		}
		switch (numshared)
		{
		case 0:
			{
				break;
			}
		case 1:
			{
				//shared vertex
				break;
			}
		case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = btGetHash(m_partIdA,m_triangleIndexA);

				btTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					btTriangleInfo tmp;
					m_triangleInfoMap->insert(hash,tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0]+sharedVertsA[1];
				int otherIndexA = 3-sumvertsA;

				
				btVector3 edge(m_triangleVerticesA[sharedVertsA[1]]-m_triangleVerticesA[sharedVertsA[0]]);

				btTriangleShape tA(m_triangleVerticesA[0],m_triangleVerticesA[1],m_triangleVerticesA[2]);
				int otherIndexB = 3-(sharedVertsB[0]+sharedVertsB[1]);

				btTriangleShape tB(triangle[sharedVertsB[1]],triangle[sharedVertsB[0]],triangle[otherIndexB]);
				//btTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				btVector3 normalA;
				btVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				btVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					btVector3 tmp = m_triangleVerticesA[otherIndexA]-m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA*=-1;
					}
				}

				btVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					btVector3 tmp = triangle[otherIndexB]-triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB*=-1;
					}
				}

				btScalar	angle2 = 0;
				btScalar	ang4 = 0.f;


				btVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				btScalar len2 = calculatedEdge.length2();

				btScalar correctedAngle(0);
				//btVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2<m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				} else
				{

					calculatedEdge.normalize();
					btVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = btGetAngle(calculatedNormalA,edgeCrossA,edgeCrossB);
					ang4 = SIMD_PI-angle2;
					btScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA<0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				

				
							
				//alternatively use 
				//btVector3 calculatedNormalB2 = quatRotate(orn,normalA);


				switch (sumvertsA)
				{
				case 1:
					{
						btVector3 edge = m_triangleVerticesA[0]-m_triangleVerticesA[1];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						btScalar bla = computedNormalB.dot(normalB);
						if (bla<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif//DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
				case 2:
					{
						btVector3 edge = m_triangleVerticesA[2]-m_triangleVerticesA[0];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;	
					}
				case 3:
					{
						btVector3 edge = m_triangleVerticesA[1]-m_triangleVerticesA[2];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB*=-1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
		default:
			{
				//				printf("warning: duplicate triangle\n");
			}

		}
	}